

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O3

QNetworkReply * __thiscall
QNetworkAccessManagerPrivate::postProcess(QNetworkAccessManagerPrivate *this,QNetworkReply *reply)

{
  QObject *pQVar1;
  long lVar2;
  int *piVar3;
  undefined8 uVar4;
  undefined4 *puVar5;
  long in_FS_OFFSET;
  Connection CStack_68;
  QObject local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&this->field_0x8;
  lVar2 = *(long *)&reply->field_0x8;
  if (pQVar1 == (QObject *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = QtSharedPointer::ExternalRefCountData::getAndRef(pQVar1);
  }
  piVar3 = *(int **)(lVar2 + 0x1e8);
  *(undefined8 *)(lVar2 + 0x1e8) = uVar4;
  *(QObject **)(lVar2 + 0x1f0) = pQVar1;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      operator_delete(piVar3);
    }
  }
  local_48 = QNetworkReply::finished;
  local_40 = 0;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/access/qnetworkaccessmanager.cpp:1576:16),_QtPrivate::List<>,_void>
       ::impl;
  *(QNetworkAccessManagerPrivate **)(puVar5 + 4) = this;
  *(QNetworkReply **)(puVar5 + 6) = reply;
  QObject::connectImpl
            (local_50,(void **)reply,(QObject *)&local_48,(void **)reply,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  local_48 = QNetworkReply::encrypted;
  local_40 = 0;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/access/qnetworkaccessmanager.cpp:1581:16),_QtPrivate::List<>,_void>
       ::impl;
  *(QNetworkAccessManagerPrivate **)(puVar5 + 4) = this;
  *(QNetworkReply **)(puVar5 + 6) = reply;
  QObject::connectImpl
            (local_58,(void **)reply,(QObject *)&local_48,(void **)reply,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  QObject::connect(local_60,(char *)reply,(QObject *)"2sslErrors(QList<QSslError>)",(char *)pQVar1,
                   0x259e78);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  QObject::connect((QObject *)&CStack_68,(char *)reply,
                   (QObject *)"2preSharedKeyAuthenticationRequired(QSslPreSharedKeyAuthenticator*)",
                   (char *)pQVar1,0x259ee1);
  QMetaObject::Connection::~Connection(&CStack_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return reply;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReply *QNetworkAccessManagerPrivate::postProcess(QNetworkReply *reply)
{
    Q_Q(QNetworkAccessManager);
    QNetworkReplyPrivate::setManager(reply, q);
    q->connect(reply, &QNetworkReply::finished, reply,
               [this, reply]() { _q_replyFinished(reply); });
#ifndef QT_NO_SSL
    /* In case we're compiled without SSL support, we don't have this signal and we need to
     * avoid getting a connection error. */
    q->connect(reply, &QNetworkReply::encrypted, reply,
               [this, reply]() { _q_replyEncrypted(reply); });
    q->connect(reply, SIGNAL(sslErrors(QList<QSslError>)), SLOT(_q_replySslErrors(QList<QSslError>)));
    q->connect(reply, SIGNAL(preSharedKeyAuthenticationRequired(QSslPreSharedKeyAuthenticator*)), SLOT(_q_replyPreSharedKeyAuthenticationRequired(QSslPreSharedKeyAuthenticator*)));
#endif

    return reply;
}